

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resload.cpp
# Opt level: O1

osfildef * __thiscall
CResLoader::open_res_file(CResLoader *this,char *respath,char *deflib,char *exerestype)

{
  FILE *pFVar1;
  char filepath [4096];
  char fname [4096];
  char acStack_2028 [4096];
  char local_1028 [4096];
  
  if (this->root_dir_ == (char *)0x0) {
    os_cvt_url_dir(acStack_2028,0x1000,respath);
  }
  else {
    os_cvt_url_dir(local_1028,0x1000,respath);
    os_build_full_path(acStack_2028,0x1000,this->root_dir_,local_1028);
  }
  pFVar1 = fopen(acStack_2028,"rb");
  if (deflib != (char *)0x0 && pFVar1 == (FILE *)0x0) {
    os_cvt_url_dir(local_1028,0x1000,deflib);
    os_build_full_path(acStack_2028,0x1000,this->root_dir_,local_1028);
    os_defext(acStack_2028,"t3r");
    pFVar1 = (FILE *)open_lib_res(this,acStack_2028,respath);
  }
  if (exerestype != (char *)0x0 && pFVar1 == (FILE *)0x0) {
    pFVar1 = (FILE *)open_exe_res(this,respath,exerestype);
  }
  return (osfildef *)pFVar1;
}

Assistant:

osfildef *CResLoader::open_res_file(const char *respath,
                                    const char *deflib,
                                    const char *exerestype)
{
    char filepath[OSFNMAX];
    osfildef *fp;
    
    /* 
     *   Look for the resource as an external file.  If we have a root
     *   directory, look for the file under that directory; otherwise,
     *   look for it in the current directory.  
     */
    if (root_dir_ != 0)
    {
        /* get the resource name as a file path */
        char fname[OSFNMAX];
        os_cvt_url_dir(fname, sizeof(fname), respath);

        /* build a full path from the root directory and the resource path */
        os_build_full_path(filepath, sizeof(filepath), root_dir_, fname);
    }
    else
    {
        /* get the resource name as a file path */
        os_cvt_url_dir(filepath, sizeof(filepath), respath);
    }

    /* try opening the file */
    fp = osfoprb(filepath, OSFTBIN);

    /* if we didn't find it, try looking in the default library */
    if (fp == 0 && deflib != 0)
    {
        char fname[OSFNMAX];

        /* convert from URL notation to local path conventions */
        os_cvt_url_dir(fname, sizeof(fname), deflib);

        /* build the full path, starting in the root resource directory */
        os_build_full_path(filepath, sizeof(filepath), root_dir_, fname);

        /* add the default resource library extension */
        os_defext(filepath, "t3r");

        /* try opening the file */
        fp = open_lib_res(filepath, respath);
    }

    /* if we still didn't find it, try looking in the executable */
    if (fp == 0 && exerestype != 0)
        fp = open_exe_res(respath, exerestype);

    /* return the result */
    return fp;
}